

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::buildNeighborList
          (ForceMatrixDecomposition *this,vector<int,_std::allocator<int>_> *neighborList,
          vector<int,_std::allocator<int>_> *point,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  pointer piVar1;
  Snapshot *this_01;
  undefined8 uVar2;
  pointer pVVar3;
  int iVar4;
  int iVar5;
  pointer pvVar6;
  ulong uVar7;
  int j_1;
  Vector<int,_3U> *v2;
  value_type_conflict *__x;
  int j;
  long lVar8;
  int j1;
  int iVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vector3i m2v;
  Vector3i whichCell;
  Vector3d scaled;
  Vector3d rs;
  Vector<double,_3U> local_1b0;
  Vector3d dr;
  Vector3d A;
  Vector3d AxB;
  Vector3d C;
  Vector3d B;
  Mat3x3d invBox;
  Mat3x3d box;
  Vector3d CxA;
  Vector3d BxC;
  
  piVar1 = (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (neighborList->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  this_01 = ((this->super_ForceDecomposition).sman_)->currentSnapshot_;
  SquareMatrix<double,_3>::SquareMatrix(&box.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&invBox.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&rs.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&scaled.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&dr.super_Vector<double,_3U>);
  Vector<int,_3U>::Vector(&whichCell.super_Vector<int,_3U>);
  this_00 = &(this->super_ForceDecomposition).cellList_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(this_00);
  std::vector<int,_std::allocator<int>_>::resize(point,(long)this->nGroups_ + 1);
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == false) {
    Snapshot::getBoundingBox((Mat3x3d *)&A,this_01);
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)&box,(RectMatrix<double,_3U,_3U> *)&A);
    Snapshot::getInvBoundingBox((Mat3x3d *)&A,this_01);
  }
  else {
    Snapshot::getHmat((Mat3x3d *)&A,this_01);
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)&box,(RectMatrix<double,_3U,_3U> *)&A);
    Snapshot::getInvHmat((Mat3x3d *)&A,this_01);
  }
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&invBox,(RectMatrix<double,_3U,_3U> *)&A);
  iVar5 = 0;
  RectMatrix<double,_3U,_3U>::getColumn
            (&B.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&box,0);
  Vector<double,_3U>::Vector(&A.super_Vector<double,_3U>,&B.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::getColumn
            (&C.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&box,1);
  Vector<double,_3U>::Vector(&B.super_Vector<double,_3U>,&C.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::getColumn
            (&AxB.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&box,2);
  Vector<double,_3U>::Vector(&C.super_Vector<double,_3U>,&AxB.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&AxB.super_Vector<double,_3U>,&A,
                (Vector3<double> *)&B.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&BxC.super_Vector<double,_3U>,
                (Vector3<double> *)&B.super_Vector<double,_3U>,
                (Vector3<double> *)&C.super_Vector<double,_3U>);
  cross<double>((Vector3<double> *)&CxA.super_Vector<double,_3U>,
                (Vector3<double> *)&C.super_Vector<double,_3U>,&A);
  Vector<double,_3U>::normalize(&AxB.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&BxC.super_Vector<double,_3U>);
  Vector<double,_3U>::normalize(&CxA.super_Vector<double,_3U>);
  dVar12 = dot<double,3u>(&A.super_Vector<double,_3U>,&BxC.super_Vector<double,_3U>);
  dVar13 = dot<double,3u>(&B.super_Vector<double,_3U>,&CxA.super_Vector<double,_3U>);
  dVar14 = dot<double,3u>(&C.super_Vector<double,_3U>,&AxB.super_Vector<double,_3U>);
  dVar17 = (this->super_ForceDecomposition).rList_;
  auVar18._0_8_ = ABS(dVar12);
  auVar18._8_8_ = ABS(dVar13);
  auVar19._8_8_ = dVar17;
  auVar19._0_8_ = dVar17;
  auVar19 = divpd(auVar18,auVar19);
  iVar15 = (int)auVar19._0_8_;
  iVar16 = (int)auVar19._8_8_;
  *(ulong *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_ =
       CONCAT44(iVar16,iVar15);
  iVar9 = (int)(ABS(dVar14) / dVar17);
  (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2] = iVar9;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(this_00,(long)(iVar15 * iVar9 * iVar16));
  if (((iVar9 < 3) || (iVar16 < 3)) || (iVar15 < 3)) {
    iVar9 = this->nGroups_;
    for (uVar10 = 0; lVar8 = (long)iVar9, (long)uVar10 < lVar8; uVar10 = uVar10 + 1) {
      (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = iVar5;
      Vector<double,_3U>::operator=
                (&rs.super_Vector<double,_3U>,
                 &(this_01->cgData).position.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Vector<double,_3U>);
      uVar7 = uVar10 & 0xffffffff;
      while( true ) {
        m2v.super_Vector<int,_3U>.data_[0] = (int)uVar7;
        iVar9 = this->nGroups_;
        if (iVar9 <= m2v.super_Vector<int,_3U>.data_[0]) break;
        operator-(&local_1b0,
                  &(this_01->cgData).position.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[m2v.super_Vector<int,_3U>.data_[0]].
                   super_Vector<double,_3U>,&rs.super_Vector<double,_3U>);
        Vector3<double>::operator=((Vector3<double> *)&dr.super_Vector<double,_3U>,&local_1b0);
        if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
          Snapshot::wrapVector(this_01,(Vector3d *)&dr.super_Vector<double,_3U>);
        }
        dVar17 = Vector<double,_3U>::lengthSquare(&dr.super_Vector<double,_3U>);
        if (dVar17 < (this->super_ForceDecomposition).rListSq_) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (neighborList,(value_type_conflict *)&m2v);
          iVar5 = iVar5 + 1;
        }
        uVar7 = (ulong)(m2v.super_Vector<int,_3U>.data_[0] + 1);
      }
    }
  }
  else {
    for (m2v.super_Vector<int,_3U>.data_[0] = 0; iVar9 = this->nGroups_,
        m2v.super_Vector<int,_3U>.data_[0] < iVar9;
        m2v.super_Vector<int,_3U>.data_[0] = m2v.super_Vector<int,_3U>.data_[0] + 1) {
      Vector<double,_3U>::operator=
                (&rs.super_Vector<double,_3U>,
                 &(this_01->cgData).position.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[m2v.super_Vector<int,_3U>.data_[0]].
                  super_Vector<double,_3U>);
      operator*(&local_1b0,(RectMatrix<double,_3U,_3U> *)&invBox,&rs.super_Vector<double,_3U>);
      Vector3<double>::operator=(&scaled,&local_1b0);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        dVar17 = scaled.super_Vector<double,_3U>.data_[lVar8];
        if (0.0 <= dVar17) {
          dVar12 = floor(dVar17 + 0.5);
        }
        else {
          dVar12 = ceil(dVar17 + -0.5);
        }
        dVar17 = (dVar17 - dVar12) + 0.5;
        scaled.super_Vector<double,_3U>.data_[lVar8] =
             (double)(~-(ulong)(dVar17 < 1.0) & (ulong)(dVar17 + -1.0) |
                     (ulong)dVar17 & -(ulong)(dVar17 < 1.0));
      }
      uVar2 = *(undefined8 *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_;
      iVar5 = (int)uVar2;
      iVar9 = (int)((ulong)uVar2 >> 0x20);
      whichCell.super_Vector<int,_3U>.data_[0] =
           (int)((double)iVar5 * scaled.super_Vector<double,_3U>.data_[0]);
      whichCell.super_Vector<int,_3U>.data_[1] =
           (int)((double)iVar9 * scaled.super_Vector<double,_3U>.data_[1]);
      whichCell.super_Vector<int,_3U>.data_[2] =
           (int)((double)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2] *
                scaled.super_Vector<double,_3U>.data_[2]);
      std::vector<int,_std::allocator<int>_>::push_back
                ((this->super_ForceDecomposition).cellList_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (whichCell.super_Vector<int,_3U>.data_[0] +
                 iVar5 * (whichCell.super_Vector<int,_3U>.data_[1] +
                         iVar9 * whichCell.super_Vector<int,_3U>.data_[2])),
                 (value_type_conflict *)&m2v);
    }
    iVar5 = 0;
    for (lVar11 = 0; lVar8 = (long)iVar9, lVar11 < lVar8; lVar11 = lVar11 + 1) {
      Vector<double,_3U>::operator=
                (&rs.super_Vector<double,_3U>,
                 &(this_01->cgData).position.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].super_Vector<double,_3U>);
      (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = iVar5;
      operator*(&local_1b0,(RectMatrix<double,_3U,_3U> *)&invBox,&rs.super_Vector<double,_3U>);
      Vector3<double>::operator=(&scaled,&local_1b0);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        dVar17 = scaled.super_Vector<double,_3U>.data_[lVar8];
        if (0.0 <= dVar17) {
          dVar12 = floor(dVar17 + 0.5);
        }
        else {
          dVar12 = ceil(dVar17 + -0.5);
        }
        dVar17 = (dVar17 - dVar12) + 0.5;
        scaled.super_Vector<double,_3U>.data_[lVar8] =
             (double)(~-(ulong)(dVar17 < 1.0) & (ulong)(dVar17 + -1.0) |
                     (ulong)dVar17 & -(ulong)(dVar17 < 1.0));
      }
      uVar2 = *(undefined8 *)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_;
      whichCell.super_Vector<int,_3U>.data_[0] =
           (int)((double)(int)uVar2 * scaled.super_Vector<double,_3U>.data_[0]);
      whichCell.super_Vector<int,_3U>.data_[1] =
           (int)((double)(int)((ulong)uVar2 >> 0x20) * scaled.super_Vector<double,_3U>.data_[1]);
      whichCell.super_Vector<int,_3U>.data_[2] =
           (int)((double)(this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2] *
                scaled.super_Vector<double,_3U>.data_[2]);
      for (v2 = &((this->super_ForceDecomposition).cellOffsets_.
                  super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_Vector<int,_3U>;
          v2 != &((this->super_ForceDecomposition).cellOffsets_.
                  super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Vector<int,_3U>; v2 = v2 + 1) {
        OpenMD::operator+((OpenMD *)&local_1b0,&whichCell.super_Vector<int,_3U>,v2);
        Vector<int,_3U>::Vector(&m2v.super_Vector<int,_3U>,(Vector<int,_3U> *)&local_1b0);
        iVar9 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[0];
        if (m2v.super_Vector<int,_3U>.data_[0] < iVar9) {
          if (m2v.super_Vector<int,_3U>.data_[0] < 0) {
            m2v.super_Vector<int,_3U>.data_[0] = iVar9 + -1;
          }
        }
        else {
          m2v.super_Vector<int,_3U>.data_[0] = 0;
        }
        iVar15 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[1];
        iVar16 = 0;
        if ((m2v.super_Vector<int,_3U>.data_[1] < iVar15) &&
           (iVar16 = m2v.super_Vector<int,_3U>.data_[1], m2v.super_Vector<int,_3U>.data_[1] < 0)) {
          iVar16 = iVar15 + -1;
        }
        m2v.super_Vector<int,_3U>.data_[1] = iVar16;
        iVar16 = (this->super_ForceDecomposition).nCells_.super_Vector<int,_3U>.data_[2];
        iVar4 = 0;
        if ((m2v.super_Vector<int,_3U>.data_[2] < iVar16) &&
           (iVar4 = m2v.super_Vector<int,_3U>.data_[2], m2v.super_Vector<int,_3U>.data_[2] < 0)) {
          iVar4 = iVar16 + -1;
        }
        m2v.super_Vector<int,_3U>.data_[2] = iVar4;
        iVar9 = (m2v.super_Vector<int,_3U>.data_[2] * iVar15 + m2v.super_Vector<int,_3U>.data_[1]) *
                iVar9 + m2v.super_Vector<int,_3U>.data_[0];
        pvVar6 = (this_00->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        for (__x = pvVar6[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            __x != *(pointer *)
                    ((long)&pvVar6[iVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8); __x = __x + 1) {
          if (lVar11 <= *__x) {
            operator-(&local_1b0,
                      &(this_01->cgData).position.
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*__x].super_Vector<double,_3U>,
                      &rs.super_Vector<double,_3U>);
            Vector3<double>::operator=((Vector3<double> *)&dr.super_Vector<double,_3U>,&local_1b0);
            if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(this_01,(Vector3d *)&dr.super_Vector<double,_3U>);
            }
            dVar17 = Vector<double,_3U>::lengthSquare(&dr.super_Vector<double,_3U>);
            if (dVar17 < (this->super_ForceDecomposition).rListSq_) {
              std::vector<int,_std::allocator<int>_>::push_back(neighborList,__x);
              iVar5 = iVar5 + 1;
            }
          }
          pvVar6 = (this_00->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
      }
      iVar9 = this->nGroups_;
    }
  }
  (point->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar8] = iVar5;
  pVVar3 = (savedPositions->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((savedPositions->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (savedPositions->
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
            (savedPositions,(long)this->nGroups_);
  lVar8 = 0;
  for (lVar11 = 0; lVar11 < this->nGroups_; lVar11 = lVar11 + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              (savedPositions,
               (value_type *)
               ((long)(((this_01->cgData).position.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).data_
               + lVar8));
    lVar8 = lVar8 + 0x18;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::buildNeighborList(
      vector<int>& neighborList, vector<int>& point,
      vector<Vector3d>& savedPositions) {
    neighborList.clear();
    point.clear();
    int len = 0;

    bool doAllPairs = false;

    Snapshot* snap_ = sman_->getCurrentSnapshot();
    Mat3x3d box;
    Mat3x3d invBox;

    Vector3d rs, scaled, dr;
    Vector3i whichCell;
    int cellIndex;

#ifdef IS_MPI
    cellListRow_.clear();
    cellListCol_.clear();
    point.resize(nGroupsInRow_ + 1);
#else
    cellList_.clear();
    point.resize(nGroups_ + 1);
#endif

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nCells_.x() = int(Wa / rList_);
    nCells_.y() = int(Wb / rList_);
    nCells_.z() = int(Wc / rList_);

    // handle small boxes where the cell offsets can end up repeating cells
    if (nCells_.x() < 3) doAllPairs = true;
    if (nCells_.y() < 3) doAllPairs = true;
    if (nCells_.z() < 3) doAllPairs = true;

    int nCtot = nCells_.x() * nCells_.y() * nCells_.z();

#ifdef IS_MPI
    cellListRow_.resize(nCtot);
    cellListCol_.resize(nCtot);
#else
    cellList_.resize(nCtot);
#endif

    if (!doAllPairs) {
#ifdef IS_MPI

      for (int i = 0; i < nGroupsInRow_; i++) {
        rs = cgRowData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListRow_[cellIndex].push_back(i);
      }
      for (int i = 0; i < nGroupsInCol_; i++) {
        rs = cgColData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListCol_[cellIndex].push_back(i);
      }

#else
      for (int i = 0; i < nGroups_; i++) {
        rs = snap_->cgData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellList_[cellIndex].push_back(i);
      }

#endif

#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        rs = cgRowData.position[j1];
#else

      for (int j1 = 0; j1 < nGroups_; j1++) {
        rs = snap_->cgData.position[j1];
#endif
        point[j1] = len;

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        for (vector<Vector3i>::iterator os = cellOffsets_.begin();
             os != cellOffsets_.end(); ++os) {
          Vector3i m2v = whichCell + (*os);

          if (m2v.x() >= nCells_.x()) {
            m2v.x() = 0;
          } else if (m2v.x() < 0) {
            m2v.x() = nCells_.x() - 1;
          }

          if (m2v.y() >= nCells_.y()) {
            m2v.y() = 0;
          } else if (m2v.y() < 0) {
            m2v.y() = nCells_.y() - 1;
          }

          if (m2v.z() >= nCells_.z()) {
            m2v.z() = 0;
          } else if (m2v.z() < 0) {
            m2v.z() = nCells_.z() - 1;
          }
          int m2 = Vlinear(m2v, nCells_);
#ifdef IS_MPI
          for (vector<int>::iterator j2 = cellListCol_[m2].begin();
               j2 != cellListCol_[m2].end(); ++j2) {
            // In parallel, we need to visit *all* pairs of row
            // & column indicies and will divide labor in the
            // force evaluation later.
            dr = cgColData.position[(*j2)] - rs;
            if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
            if (dr.lengthSquare() < rListSq_) {
              neighborList.push_back((*j2));
              ++len;
            }
          }
#else
          for (vector<int>::iterator j2 = cellList_[m2].begin();
               j2 != cellList_[m2].end(); ++j2) {
            // Always do this if we're in different cells or if
            // we're in the same cell and the global index of
            // the j2 cutoff group is greater than or equal to
            // the j1 cutoff group.  Note that Rappaport's code
            // has a "less than" conditional here, but that
            // deals with atom-by-atom computation.  OpenMD
            // allows atoms within a single cutoff group to
            // interact with each other.

            if ((*j2) >= j1) {
              dr = snap_->cgData.position[(*j2)] - rs;
              if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
              if (dr.lengthSquare() < rListSq_) {
                neighborList.push_back((*j2));
                ++len;
              }
            }
          }
#endif
        }
      }
    } else {
      // branch to do all cutoff group pairs
#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        point[j1] = len;
        rs        = cgRowData.position[j1];
        for (int j2 = 0; j2 < nGroupsInCol_; j2++) {
          dr = cgColData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#else
      // include all groups here.
      for (int j1 = 0; j1 < nGroups_; j1++) {
        point[j1] = len;
        rs        = snap_->cgData.position[j1];
        // include self group interactions j2 == j1
        for (int j2 = j1; j2 < nGroups_; j2++) {
          dr = snap_->cgData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#endif
    }

#ifdef IS_MPI
    point[nGroupsInRow_] = len;
#else
    point[nGroups_] = len;
#endif

    // save the local cutoff group positions for the check that is
    // done on each loop:
    savedPositions.clear();
    savedPositions.reserve(nGroups_);
    for (int i = 0; i < nGroups_; i++)
      savedPositions.push_back(snap_->cgData.position[i]);
  }